

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O2

int mg_session_write_container_size(mg_session *session,uint32_t size,uint8_t *markers)

{
  int iVar1;
  
  if (0xf < size) {
    if (size < 0x100) {
      iVar1 = mg_session_write_uint8(session,markers[1]);
      if (iVar1 == 0) goto LAB_00107d2d;
    }
    else if (size < 0x10000) {
      iVar1 = mg_session_write_uint8(session,markers[2]);
      if (iVar1 == 0) {
        iVar1 = mg_session_write_uint16(session,(uint16_t)size);
        return iVar1;
      }
    }
    else {
      iVar1 = mg_session_write_uint8(session,markers[3]);
      if (iVar1 == 0) {
        iVar1 = mg_session_write_uint32(session,size);
        return iVar1;
      }
    }
    return iVar1;
  }
  size = (uint32_t)(byte)((char)size + *markers);
LAB_00107d2d:
  iVar1 = mg_session_write_uint8(session,(uint8_t)size);
  return iVar1;
}

Assistant:

int mg_session_write_container_size(mg_session *session, uint32_t size,
                                    const uint8_t *markers) {
  if (size <= MG_TINY_SIZE_MAX) {
    return mg_session_write_uint8(session, (uint8_t)(markers[0] + size));
  }
  if (size <= UINT8_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[1]));
    return mg_session_write_uint8(session, (uint8_t)size);
  }
  if (size <= UINT16_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[2]));
    return mg_session_write_uint16(session, (uint16_t)size);
  }
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[3]));
  return mg_session_write_uint32(session, size);
}